

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix.cpp
# Opt level: O1

void __thiscall maths::Matrix::Matrix(Matrix *this,int rows,int cols)

{
  int iVar1;
  uint uVar2;
  double **ppdVar3;
  long lVar4;
  
  this->rows_ = rows;
  this->cols_ = cols;
  allocSpace(this);
  iVar1 = this->rows_;
  if (0 < (long)iVar1) {
    uVar2 = this->cols_;
    ppdVar3 = this->p;
    lVar4 = 0;
    do {
      if (0 < (int)uVar2) {
        memset(ppdVar3[lVar4],0,(ulong)uVar2 << 3);
      }
      lVar4 = lVar4 + 1;
    } while (iVar1 != lVar4);
  }
  return;
}

Assistant:

Matrix::Matrix(int rows, int cols) : rows_(rows), cols_(cols)
{
    allocSpace();
    for (int i = 0; i < rows_; ++i) {
        for (int j = 0; j < cols_; ++j) {
            p[i][j] = 0;
        }
    }
}